

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O0

void __thiscall
cmMessenger::DisplayMessage
          (cmMessenger *this,MessageType t,string *text,cmListFileBacktrace *backtrace)

{
  bool bVar1;
  undefined1 local_1a0 [8];
  ostringstream msg;
  cmListFileBacktrace *backtrace_local;
  string *text_local;
  MessageType t_local;
  cmMessenger *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  bVar1 = printMessagePreamble(t,(ostream *)local_1a0);
  if (bVar1) {
    cmListFileBacktrace::PrintTitle(backtrace,(ostream *)local_1a0);
    printMessageText((ostream *)local_1a0,text);
    cmListFileBacktrace::PrintCallStack(backtrace,(ostream *)local_1a0);
    displayMessage(t,(ostringstream *)local_1a0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return;
}

Assistant:

void cmMessenger::DisplayMessage(MessageType t, const std::string& text,
                                 const cmListFileBacktrace& backtrace) const
{
  std::ostringstream msg;
  if (!printMessagePreamble(t, msg)) {
    return;
  }

  // Add the immediate context.
  backtrace.PrintTitle(msg);

  printMessageText(msg, text);

  // Add the rest of the context.
  backtrace.PrintCallStack(msg);

  displayMessage(t, msg);
}